

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.cpp
# Opt level: O0

uint __thiscall o3dgc::Arithmetic_Codec::get_bits(Arithmetic_Codec *this,uint bits)

{
  uint uVar1;
  uint s;
  uint bits_local;
  Arithmetic_Codec *this_local;
  
  uVar1 = this->length >> ((byte)bits & 0x1f);
  this->length = uVar1;
  uVar1 = this->value / uVar1;
  this->value = this->value - this->length * uVar1;
  if (this->length < 0x1000000) {
    renorm_dec_interval(this);
  }
  return uVar1;
}

Assistant:

unsigned Arithmetic_Codec::get_bits(unsigned bits)
    {
    #ifdef _DEBUG
      if (mode != 2) AC_Error("decoder not initialized");
      if ((bits < 1) || (bits > 20)) AC_Error("invalid number of bits");
    #endif

      unsigned s = value / (length >>= bits);      // decode symbol, change length

      value -= length * s;                                      // update interval
      if (length < AC__MinLength) renorm_dec_interval();        // renormalization

      return s;
    }